

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

void __thiscall
pbrt::PtexTextureBase::PtexTextureBase
          (PtexTextureBase *this,string *filename,ColorEncodingHandle *encoding)

{
  PtexCache *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  String error;
  long *plVar3;
  
  std::__cxx11::string::string((string *)&this->filename,(string *)filename);
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
  if (cache == (PtexCache *)0x0) {
    cache = Ptex::v2_2::PtexCache::create
                      (100,0x100000000,true,(PtexInputHandler *)0x0,
                       (PtexErrorHandler *)&errorHandler);
  }
  pPVar1 = cache;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  this->valid = false;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  iVar2 = (*pPVar1->_vptr_PtexCache[5])(pPVar1,(filename->_M_dataplus)._M_p,&error);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 == (long *)0x0) {
    Error<std::__cxx11::string&>("%s",&error);
    goto LAB_002d4441;
  }
  iVar2 = (**(code **)(*plVar3 + 0x58))();
  if (iVar2 == 1) {
LAB_002d43e6:
    this->valid = true;
    if (LOGGING_LogLevel < 1) {
      Log<std::__cxx11::string_const&>
                (Verbose,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                 ,0x27a,"%s: added ptex texture",filename);
    }
  }
  else {
    iVar2 = (**(code **)(*plVar3 + 0x58))();
    if (iVar2 == 3) goto LAB_002d43e6;
    Error<std::__cxx11::string_const&>
              ("%s: only one and three channel ptex textures are supported",filename);
  }
  (**(code **)(*plVar3 + 0x10))(plVar3);
LAB_002d4441:
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

PtexTextureBase::PtexTextureBase(const std::string &filename,
                                 ColorEncodingHandle encoding)
    : filename(filename), encoding(encoding) {
    if (cache == nullptr) {
        int maxFiles = 100;
        size_t maxMem = 1ull << 32;  // 4GB
        bool premultiply = true;

        cache = Ptex::PtexCache::create(maxFiles, maxMem, premultiply, nullptr,
                                        &errorHandler);
        // TODO? cache->setSearchPath(...);
    }

    // Issue an error if the texture doesn't exist or has an unsupported
    // number of channels.
    valid = false;
    Ptex::String error;
    Ptex::PtexTexture *texture = cache->get(filename.c_str(), error);
    if (texture == nullptr)
        Error("%s", error);
    else {
        if (texture->numChannels() != 1 && texture->numChannels() != 3)
            Error("%s: only one and three channel ptex textures are supported", filename);
        else {
            valid = true;
            LOG_VERBOSE("%s: added ptex texture", filename);
        }
        texture->release();
    }
}